

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.cxx
# Opt level: O0

bool cmConfigureFileCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  bool bVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  const_reference pvVar7;
  cmMakefile *pcVar8;
  string *psVar9;
  ulong uVar10;
  reference arg;
  ostream *poVar11;
  reference pvVar12;
  key_type kVar13;
  allocator<char> local_601;
  string local_600;
  Style local_5dc;
  string local_5d8;
  uint local_5b4;
  undefined1 local_5b0 [4];
  uint i_1;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e_1;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  invalidOptions;
  string local_3f8;
  mode_t local_3d8;
  allocator<char> local_3d1;
  mode_t permissions;
  undefined1 local_3b0 [8];
  string msg;
  key_type local_388;
  _Self local_378;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  uint local_2a8;
  byte local_2a1;
  uint i;
  bool atOnly;
  string unknown_args;
  string_view local_208;
  string_view local_1f8;
  string_view local_1e8;
  string_view local_1d8;
  string_view local_1c8;
  string_view local_1b8;
  string_view local_1a8;
  iterator local_190;
  size_type local_188;
  int local_17c;
  undefined1 local_178 [4];
  Doing doing;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filePermissionOptions;
  bool local_156;
  bool local_155;
  cmNewLineStyle cStack_154;
  bool filePermissions;
  bool noSourcePermissions;
  bool useSourcePermissions;
  bool escapeQuotes;
  bool copyOnly;
  cmNewLineStyle newLineStyle;
  string errorMessage;
  undefined1 local_110 [8];
  string e;
  undefined1 local_d0 [8];
  string outputFile;
  string *outFile;
  string local_a0;
  undefined1 local_80 [8];
  string inputFile;
  string *inFile;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar2 = local_20;
  if (sVar6 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments, expected 2",&local_41
              );
    cmExecutionStatus::SetError(pcVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_00770b1b;
  }
  pvVar7 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
  inputFile.field_2._8_8_ = pvVar7;
  pcVar8 = cmExecutionStatus::GetMakefile(local_20);
  psVar9 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar8);
  cmsys::SystemTools::CollapseFullPath((string *)local_80,pvVar7,psVar9);
  bVar3 = cmsys::SystemTools::FileIsDirectory((string *)local_80);
  pcVar2 = local_20;
  if (bVar3) {
    cmStrCat<char_const(&)[18],std::__cxx11::string_const&,char_const(&)[41]>
              (&local_a0,(char (*) [18])"input location\n  ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               (char (*) [41])"\nis a directory but a file was expected.");
    cmExecutionStatus::SetError(pcVar2,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    args_local._7_1_ = 0;
  }
  else {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    outputFile.field_2._8_8_ = pvVar7;
    pcVar8 = cmExecutionStatus::GetMakefile(local_20);
    psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar8);
    cmsys::SystemTools::CollapseFullPath((string *)local_d0,pvVar7,psVar9);
    bVar3 = cmsys::SystemTools::FileIsDirectory((string *)local_d0);
    if (bVar3) {
      std::__cxx11::string::operator+=((string *)local_d0,"/");
      cmsys::SystemTools::GetFilenameName
                ((string *)((long)&e.field_2 + 8),(string *)inputFile.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_d0,(string *)(e.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(e.field_2._M_local_buf + 8));
    }
    pcVar8 = cmExecutionStatus::GetMakefile(local_20);
    bVar3 = cmMakefile::CanIWriteThisFile(pcVar8,(string *)local_d0);
    if (bVar3) {
      std::__cxx11::string::string((string *)&noSourcePermissions);
      cmNewLineStyle::cmNewLineStyle(&stack0xfffffffffffffeac);
      bVar3 = cmNewLineStyle::ReadFromArguments
                        (&stack0xfffffffffffffeac,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local,(string *)&noSourcePermissions);
      if (bVar3) {
        local_155 = false;
        local_156 = false;
        bVar3 = false;
        bVar1 = false;
        filePermissionOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_178);
        local_17c = 0;
        if (cmConfigureFileCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
            ::noopOptions == '\0') {
          iVar5 = __cxa_guard_acquire(&cmConfigureFileCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                       ::noopOptions);
          if (iVar5 != 0) {
            local_208 = (string_view)cm::operator____s("IMMEDIATE",9);
            local_1f8 = (string_view)cm::operator____s("NEWLINE_STYLE",0xd);
            local_1e8 = (string_view)cm::operator____s("LF",2);
            local_1d8 = (string_view)cm::operator____s("UNIX",4);
            local_1c8 = (string_view)cm::operator____s("CRLF",4);
            local_1b8 = (string_view)cm::operator____s("WIN32",5);
            local_1a8 = (string_view)cm::operator____s("DOS",3);
            local_190 = &local_208;
            local_188 = 7;
            std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator
                      ((allocator<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                       (unknown_args.field_2._M_local_buf + 0xe));
            __l._M_len = local_188;
            __l._M_array = local_190;
            std::
            set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::set(&cmConfigureFileCommand::noopOptions,__l,
                  (less<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                  (unknown_args.field_2._M_local_buf + 0xf),
                  (allocator<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                  (unknown_args.field_2._M_local_buf + 0xe));
            std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator
                      ((allocator<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                       (unknown_args.field_2._M_local_buf + 0xe));
            __cxa_atexit(std::
                         set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ::~set,&cmConfigureFileCommand::noopOptions,&__dso_handle);
            __cxa_guard_release(&cmConfigureFileCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::noopOptions);
          }
        }
        std::__cxx11::string::string((string *)&i);
        local_2a1 = 0;
        local_2a8 = 2;
        while( true ) {
          uVar10 = (ulong)local_2a8;
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
          if (sVar6 <= uVar10) break;
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(ulong)local_2a8);
          bVar4 = std::operator==(pvVar7,"COPYONLY");
          if (bVar4) {
            if (local_17c == 1) {
              local_17c = 2;
            }
            local_155 = true;
            bVar4 = cmNewLineStyle::IsValid(&stack0xfffffffffffffeac);
            pcVar2 = local_20;
            if (bVar4) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2c8,
                         "COPYONLY could not be used in combination with NEWLINE_STYLE",&local_2c9);
              cmExecutionStatus::SetError(pcVar2,&local_2c8);
              std::__cxx11::string::~string((string *)&local_2c8);
              std::allocator<char>::~allocator(&local_2c9);
              args_local._7_1_ = 0;
              goto LAB_00770a99;
            }
          }
          else {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,(ulong)local_2a8);
            bVar4 = std::operator==(pvVar7,"ESCAPE_QUOTES");
            if (bVar4) {
              if (local_17c == 1) {
                local_17c = 2;
              }
              local_156 = true;
            }
            else {
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,(ulong)local_2a8);
              bVar4 = std::operator==(pvVar7,"@ONLY");
              if (bVar4) {
                if (local_17c == 1) {
                  local_17c = 2;
                }
                local_2a1 = 1;
              }
              else {
                pvVar7 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)status_local,(ulong)local_2a8);
                bVar4 = std::operator==(pvVar7,"NO_SOURCE_PERMISSIONS");
                pcVar2 = local_20;
                if (bVar4) {
                  if (local_17c == 1) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2f0,
                               " given both FILE_PERMISSIONS and NO_SOURCE_PERMISSIONS. Only one option allowed."
                               ,&local_2f1);
                    cmExecutionStatus::SetError(pcVar2,&local_2f0);
                    std::__cxx11::string::~string((string *)&local_2f0);
                    std::allocator<char>::~allocator(&local_2f1);
                    args_local._7_1_ = 0;
                    goto LAB_00770a99;
                  }
                  bVar1 = true;
                }
                else {
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_2a8);
                  bVar4 = std::operator==(pvVar7,"USE_SOURCE_PERMISSIONS");
                  pcVar2 = local_20;
                  if (bVar4) {
                    if (local_17c == 1) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_318,
                                 " given both FILE_PERMISSIONS and USE_SOURCE_PERMISSIONS. Only one option allowed."
                                 ,&local_319);
                      cmExecutionStatus::SetError(pcVar2,&local_318);
                      std::__cxx11::string::~string((string *)&local_318);
                      std::allocator<char>::~allocator(&local_319);
                      args_local._7_1_ = 0;
                      goto LAB_00770a99;
                    }
                    bVar3 = true;
                  }
                  else {
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)status_local,(ulong)local_2a8);
                    bVar4 = std::operator==(pvVar7,"FILE_PERMISSIONS");
                    pcVar2 = local_20;
                    if (bVar4) {
                      if (bVar3) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_340,
                                   " given both FILE_PERMISSIONS and USE_SOURCE_PERMISSIONS. Only one option allowed."
                                   ,&local_341);
                        cmExecutionStatus::SetError(pcVar2,&local_340);
                        std::__cxx11::string::~string((string *)&local_340);
                        std::allocator<char>::~allocator(&local_341);
                        args_local._7_1_ = 0;
                        goto LAB_00770a99;
                      }
                      if (bVar1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_368,
                                   " given both FILE_PERMISSIONS and NO_SOURCE_PERMISSIONS. Only one option allowed."
                                   ,&local_369);
                        cmExecutionStatus::SetError(pcVar2,&local_368);
                        std::__cxx11::string::~string((string *)&local_368);
                        std::allocator<char>::~allocator(&local_369);
                        args_local._7_1_ = 0;
                        goto LAB_00770a99;
                      }
                      if (local_17c == 0) {
                        local_17c = 1;
                        filePermissionOptions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
                      }
                    }
                    else {
                      pvVar7 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)status_local,(ulong)local_2a8);
                      kVar13 = (key_type)
                               std::__cxx11::string::operator_cast_to_basic_string_view
                                         ((string *)pvVar7);
                      local_388 = kVar13;
                      local_378._M_node =
                           (_Base_ptr)
                           std::
                           set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ::find(&cmConfigureFileCommand::noopOptions,&local_388);
                      msg.field_2._8_8_ =
                           std::
                           set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ::end(&cmConfigureFileCommand::noopOptions);
                      bVar4 = std::operator!=(&local_378,(_Self *)((long)&msg.field_2 + 8));
                      if (!bVar4) {
                        if (local_17c == 1) {
                          pvVar7 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)status_local,(ulong)local_2a8);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_178,pvVar7);
                        }
                        else {
                          std::__cxx11::string::operator+=((string *)&i," ");
                          pvVar7 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)status_local,(ulong)local_2a8);
                          std::__cxx11::string::operator+=((string *)&i,(string *)pvVar7);
                          std::__cxx11::string::operator+=((string *)&i,"\n");
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          local_2a8 = local_2a8 + 1;
        }
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          cmStrCat<char_const(&)[49],std::__cxx11::string&>
                    ((string *)local_3b0,
                     (char (*) [49])"configure_file called with unknown argument(s):\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
          pcVar8 = cmExecutionStatus::GetMakefile(local_20);
          cmMakefile::IssueMessage(pcVar8,AUTHOR_WARNING,(string *)local_3b0);
          std::__cxx11::string::~string((string *)local_3b0);
        }
        pcVar2 = local_20;
        if ((bVar3) && (bVar1)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&permissions,
                     " given both USE_SOURCE_PERMISSIONS and NO_SOURCE_PERMISSIONS. Only one option allowed."
                     ,&local_3d1);
          cmExecutionStatus::SetError(pcVar2,(string *)&permissions);
          std::__cxx11::string::~string((string *)&permissions);
          std::allocator<char>::~allocator(&local_3d1);
          args_local._7_1_ = 0;
        }
        else {
          local_3d8 = 0;
          if ((filePermissionOptions.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
LAB_00770915:
            if (bVar1) {
              local_3d8 = local_3d8 | 0x1a4;
            }
            pcVar8 = cmExecutionStatus::GetMakefile(local_20);
            local_5dc = cStack_154.NewLineStyle;
            iVar5 = cmMakefile::ConfigureFile
                              (pcVar8,(string *)local_80,(string *)local_d0,local_155,
                               (bool)(local_2a1 & 1),local_156,local_3d8,cStack_154);
            pcVar2 = local_20;
            if (iVar5 == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_600,"Problem configuring file",&local_601);
              cmExecutionStatus::SetError(pcVar2,&local_600);
              std::__cxx11::string::~string((string *)&local_600);
              std::allocator<char>::~allocator(&local_601);
              args_local._7_1_ = 0;
            }
            else {
              args_local._7_1_ = 1;
            }
          }
          else {
            bVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_178);
            pcVar2 = local_20;
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3f8," given FILE_PERMISSIONS without any options.",
                         (allocator<char> *)
                         ((long)&invalidOptions.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              cmExecutionStatus::SetError(pcVar2,&local_3f8);
              std::__cxx11::string::~string((string *)&local_3f8);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&invalidOptions.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              args_local._7_1_ = 0;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
              __end2 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_178);
              e_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_178);
              while( true ) {
                bVar3 = __gnu_cxx::operator!=
                                  (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)&e_1);
                if (!bVar3) break;
                arg = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end2);
                bVar3 = cmFSPermissions::stringToModeT(arg,&local_3d8);
                if (!bVar3) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&__range2,arg);
                }
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end2);
              }
              bVar3 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&__range2);
              if (bVar3) {
                bVar3 = false;
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
                std::operator<<((ostream *)local_5b0," given invalid permission ");
                local_5b4 = 0;
                while( true ) {
                  uVar10 = (ulong)local_5b4;
                  sVar6 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&__range2);
                  if (sVar6 <= uVar10) break;
                  if (local_5b4 == 0) {
                    poVar11 = std::operator<<((ostream *)local_5b0,"\"");
                    pvVar12 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)&__range2,(ulong)local_5b4);
                    poVar11 = std::operator<<(poVar11,(string *)pvVar12);
                    std::operator<<(poVar11,"\"");
                  }
                  else {
                    poVar11 = std::operator<<((ostream *)local_5b0,",\"");
                    pvVar12 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)&__range2,(ulong)local_5b4);
                    poVar11 = std::operator<<(poVar11,(string *)pvVar12);
                    std::operator<<(poVar11,"\"");
                  }
                  local_5b4 = local_5b4 + 1;
                }
                std::operator<<((ostream *)local_5b0,".");
                pcVar2 = local_20;
                std::__cxx11::ostringstream::str();
                cmExecutionStatus::SetError(pcVar2,&local_5d8);
                std::__cxx11::string::~string((string *)&local_5d8);
                args_local._7_1_ = 0;
                bVar3 = true;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range2);
              if (!bVar3) goto LAB_00770915;
            }
          }
        }
LAB_00770a99:
        std::__cxx11::string::~string((string *)&i);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_178);
      }
      else {
        cmExecutionStatus::SetError(local_20,(string *)&noSourcePermissions);
        args_local._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)&noSourcePermissions);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&errorMessage.field_2 + 8),"attempted to configure a file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&errorMessage.field_2 + 8)," into a source directory.");
      std::__cxx11::string::~string((string *)(errorMessage.field_2._M_local_buf + 8));
      cmExecutionStatus::SetError(local_20,(string *)local_110);
      cmSystemTools::SetFatalErrorOccurred();
      args_local._7_1_ = 0;
      std::__cxx11::string::~string((string *)local_110);
    }
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::__cxx11::string::~string((string *)local_80);
LAB_00770b1b:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmConfigureFileCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments, expected 2");
    return false;
  }

  std::string const& inFile = args[0];
  const std::string inputFile = cmSystemTools::CollapseFullPath(
    inFile, status.GetMakefile().GetCurrentSourceDirectory());

  // If the input location is a directory, error out.
  if (cmSystemTools::FileIsDirectory(inputFile)) {
    status.SetError(cmStrCat("input location\n  ", inputFile,
                             "\n"
                             "is a directory but a file was expected."));
    return false;
  }

  std::string const& outFile = args[1];
  std::string outputFile = cmSystemTools::CollapseFullPath(
    outFile, status.GetMakefile().GetCurrentBinaryDirectory());

  // If the output location is already a directory put the file in it.
  if (cmSystemTools::FileIsDirectory(outputFile)) {
    outputFile += "/";
    outputFile += cmSystemTools::GetFilenameName(inFile);
  }

  if (!status.GetMakefile().CanIWriteThisFile(outputFile)) {
    std::string e = "attempted to configure a file: " + outputFile +
      " into a source directory.";
    status.SetError(e);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  std::string errorMessage;
  cmNewLineStyle newLineStyle;
  if (!newLineStyle.ReadFromArguments(args, errorMessage)) {
    status.SetError(errorMessage);
    return false;
  }
  bool copyOnly = false;
  bool escapeQuotes = false;
  bool useSourcePermissions = false;
  bool noSourcePermissions = false;
  bool filePermissions = false;
  std::vector<std::string> filePermissionOptions;

  enum class Doing
  {
    DoingNone,
    DoingFilePermissions,
    DoneFilePermissions
  };

  Doing doing = Doing::DoingNone;

  static std::set<cm::string_view> noopOptions = {
    /* Legacy.  */
    "IMMEDIATE"_s,
    /* Handled by NewLineStyle member.  */
    "NEWLINE_STYLE"_s,
    "LF"_s,
    "UNIX"_s,
    "CRLF"_s,
    "WIN32"_s,
    "DOS"_s,
  };

  std::string unknown_args;
  bool atOnly = false;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i] == "COPYONLY") {
      if (doing == Doing::DoingFilePermissions) {
        doing = Doing::DoneFilePermissions;
      }
      copyOnly = true;
      if (newLineStyle.IsValid()) {
        status.SetError("COPYONLY could not be used in combination "
                        "with NEWLINE_STYLE");
        return false;
      }
    } else if (args[i] == "ESCAPE_QUOTES") {
      if (doing == Doing::DoingFilePermissions) {
        doing = Doing::DoneFilePermissions;
      }
      escapeQuotes = true;
    } else if (args[i] == "@ONLY") {
      if (doing == Doing::DoingFilePermissions) {
        doing = Doing::DoneFilePermissions;
      }
      atOnly = true;
    } else if (args[i] == "NO_SOURCE_PERMISSIONS") {
      if (doing == Doing::DoingFilePermissions) {
        status.SetError(" given both FILE_PERMISSIONS and "
                        "NO_SOURCE_PERMISSIONS. Only one option allowed.");
        return false;
      }
      noSourcePermissions = true;
    } else if (args[i] == "USE_SOURCE_PERMISSIONS") {
      if (doing == Doing::DoingFilePermissions) {
        status.SetError(" given both FILE_PERMISSIONS and "
                        "USE_SOURCE_PERMISSIONS. Only one option allowed.");
        return false;
      }
      useSourcePermissions = true;
    } else if (args[i] == "FILE_PERMISSIONS") {
      if (useSourcePermissions) {
        status.SetError(" given both FILE_PERMISSIONS and "
                        "USE_SOURCE_PERMISSIONS. Only one option allowed.");
        return false;
      }
      if (noSourcePermissions) {
        status.SetError(" given both FILE_PERMISSIONS and "
                        "NO_SOURCE_PERMISSIONS. Only one option allowed.");
        return false;
      }

      if (doing == Doing::DoingNone) {
        doing = Doing::DoingFilePermissions;
        filePermissions = true;
      }
    } else if (noopOptions.find(args[i]) != noopOptions.end()) {
      /* Ignore no-op options.  */
    } else if (doing == Doing::DoingFilePermissions) {
      filePermissionOptions.push_back(args[i]);
    } else {
      unknown_args += " ";
      unknown_args += args[i];
      unknown_args += "\n";
    }
  }
  if (!unknown_args.empty()) {
    std::string msg = cmStrCat(
      "configure_file called with unknown argument(s):\n", unknown_args);
    status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, msg);
  }

  if (useSourcePermissions && noSourcePermissions) {
    status.SetError(" given both USE_SOURCE_PERMISSIONS and "
                    "NO_SOURCE_PERMISSIONS. Only one option allowed.");
    return false;
  }

  mode_t permissions = 0;

  if (filePermissions) {
    if (filePermissionOptions.empty()) {
      status.SetError(" given FILE_PERMISSIONS without any options.");
      return false;
    }

    std::vector<std::string> invalidOptions;
    for (auto const& e : filePermissionOptions) {
      if (!cmFSPermissions::stringToModeT(e, permissions)) {
        invalidOptions.push_back(e);
      }
    }

    if (!invalidOptions.empty()) {
      std::ostringstream oss;
      oss << " given invalid permission ";
      for (auto i = 0u; i < invalidOptions.size(); i++) {
        if (i == 0u) {
          oss << "\"" << invalidOptions[i] << "\"";
        } else {
          oss << ",\"" << invalidOptions[i] << "\"";
        }
      }
      oss << ".";
      status.SetError(oss.str());
      return false;
    }
  }

  if (noSourcePermissions) {
    permissions |= cmFSPermissions::mode_owner_read;
    permissions |= cmFSPermissions::mode_owner_write;
    permissions |= cmFSPermissions::mode_group_read;
    permissions |= cmFSPermissions::mode_world_read;
  }

  if (!status.GetMakefile().ConfigureFile(inputFile, outputFile, copyOnly,
                                          atOnly, escapeQuotes, permissions,
                                          newLineStyle)) {
    status.SetError("Problem configuring file");
    return false;
  }

  return true;
}